

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatCnfReader.c
# Opt level: O3

char * xSAT_FileRead(FILE *pFile)

{
  long lVar1;
  char *__ptr;
  
  fseek((FILE *)pFile,0,2);
  lVar1 = ftell((FILE *)pFile);
  rewind((FILE *)pFile);
  __ptr = (char *)malloc((lVar1 << 0x20) + 0x300000000 >> 0x20);
  fread(__ptr,(long)(int)lVar1,1,(FILE *)pFile);
  __ptr[(int)lVar1] = '\n';
  __ptr[(lVar1 << 0x20) + 0x100000000 >> 0x20] = '\0';
  return __ptr;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Read the file into the internal buffer.]

  Description []

  SideEffects []

  SeeAlso     []

***********************************************************************/
char * xSAT_FileRead( FILE * pFile )
{
    int nFileSize;
    char * pBuffer;
    int RetValue;
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );
    nFileSize = ftell( pFile );
    // move the file current reading position to the beginning
    rewind( pFile );
    // load the contents of the file into memory
    pBuffer = ABC_ALLOC( char, nFileSize + 3 );
    RetValue = fread( pBuffer, nFileSize, 1, pFile );
    // terminate the string with '\0'
    pBuffer[ nFileSize + 0] = '\n';
    pBuffer[ nFileSize + 1] = '\0';
    return pBuffer;
}